

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playground.cpp
# Opt level: O3

bool initializeVertexbuffer(void)

{
  (*__glewGenVertexArrays)(1,&VertexArrayID);
  (*__glewBindVertexArray)(VertexArrayID);
  vertexbuffer_size = 3;
  (*__glewGenBuffers)(1,&vertexbuffer);
  (*__glewBindBuffer)(0x8892,vertexbuffer);
  (*__glewBufferData)(0x8892,0x24,initializeVertexbuffer::g_vertex_buffer_data,0x88e4);
  return true;
}

Assistant:

bool initializeVertexbuffer()
{
  glGenVertexArrays(1, &VertexArrayID);
  glBindVertexArray(VertexArrayID);

  vertexbuffer_size = 3;
  static const GLfloat g_vertex_buffer_data[] = {
    -1.0f, -1.0f, 0.0f,
    1.0f, -1.0f, 0.0f,
    0.0f,  1.0f, 0.0f,
  };

  glGenBuffers(1, &vertexbuffer);
  glBindBuffer(GL_ARRAY_BUFFER, vertexbuffer);
  glBufferData(GL_ARRAY_BUFFER, sizeof(g_vertex_buffer_data), g_vertex_buffer_data, GL_STATIC_DRAW);

  return true;
}